

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O2

void client_handle_read(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                       cio_read_buffer *read_buffer,size_t num_bytes)

{
  cio_write_buffer *wbh;
  FILE *__s;
  char *__ptr;
  size_t sStack_b0;
  uint8_t recv_buffer [128];
  
  if (err == CIO_SUCCESS) {
    memcpy(recv_buffer,read_buffer->fetch_ptr,num_bytes);
    recv_buffer[num_bytes] = '\0';
    fprintf(_stdout,"Client received data: %s , now sending...\n",recv_buffer);
    *(size_t *)handler_context = num_bytes;
    wbh = (cio_write_buffer *)((long)handler_context + 0xa8);
    *(cio_write_buffer **)((long)handler_context + 0xb0) = wbh;
    *(cio_write_buffer **)((long)handler_context + 0xa8) = wbh;
    *(undefined8 *)((long)handler_context + 0xb8) = 0;
    *(undefined8 *)((long)handler_context + 0xc0) = 0;
    *(uint8_t **)((long)handler_context + 0xd8) = read_buffer->fetch_ptr;
    *(size_t *)((long)handler_context + 0xe0) = num_bytes;
    cio_write_buffer_queue_tail(wbh,(cio_write_buffer *)((long)handler_context + 200));
    cio_buffered_stream_write(buffered_stream,wbh,client_handle_write,handler_context);
    return;
  }
  if (err == CIO_EOF) {
    __ptr = "connection closed by peer\n";
    sStack_b0 = 0x1a;
    __s = _stdout;
  }
  else {
    __ptr = "read error!\n";
    sStack_b0 = 0xc;
    __s = _stderr;
  }
  fwrite(__ptr,sStack_b0,1,__s);
  cio_buffered_stream_close(buffered_stream);
  return;
}

Assistant:

static void client_handle_read(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t num_bytes)
{
	struct client *client = handler_context;

	if (cio_unlikely(err == CIO_EOF)) {
		(void)fprintf(stdout, "connection closed by peer\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "read error!\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	uint8_t recv_buffer[BUFFER_SIZE];
	memcpy(recv_buffer, cio_read_buffer_get_read_ptr(read_buffer), num_bytes);
	recv_buffer[num_bytes] = '\0';
	(void)fprintf(stdout, "Client received data: %s , now sending...\n", recv_buffer);

	client->bytes_read = num_bytes;
	cio_write_buffer_head_init(&client->wbh);
	cio_write_buffer_element_init(&client->wb, cio_read_buffer_get_read_ptr(read_buffer), num_bytes);
	cio_write_buffer_queue_tail(&client->wbh, &client->wb);
	cio_buffered_stream_write(buffered_stream, &client->wbh, client_handle_write, client);
}